

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  bool bVar7;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_128;
  AssertionResult local_d0;
  
  pcVar3 = (this->m_lastAssertionInfo).macroName.m_data;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->m_lastAssertionInfo).macroName.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = (info->macroName).m_start;
  (this->m_lastAssertionInfo).macroName.m_size = (info->macroName).m_size;
  sVar5 = (info->lineInfo).line;
  (this->m_lastAssertionInfo).lineInfo.file = (info->lineInfo).file;
  (this->m_lastAssertionInfo).lineInfo.line = sVar5;
  pcVar3 = (this->m_lastAssertionInfo).capturedExpression.m_data;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  (this->m_lastAssertionInfo).capturedExpression.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  paVar1 = &local_128.message.field_2;
  local_128.message._M_string_length = 0;
  local_128.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_128.reconstructedExpression.field_2;
  local_128.reconstructedExpression._M_string_length = 0;
  local_128.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_128.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_128.lazyExpression.m_isNegated = false;
  local_128.resultType = ThrewException;
  local_128.message._M_dataplus._M_p = (pointer)paVar1;
  local_128.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_assign((string *)&local_128);
  AssertionResult::AssertionResult(&local_d0,info,&local_128);
  assertionEnded(this,&local_d0);
  iVar6 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[6])();
  reaction->shouldDebugBreak = SUB41(iVar6,0);
  uVar4 = (this->m_totals).assertions.failed;
  iVar6 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  bVar7 = true;
  if (uVar4 < (ulong)(long)iVar6) {
    bVar7 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
  }
  reaction->shouldThrow = bVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_d0.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_d0.m_resultData.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_resultData.message._M_dataplus._M_p != &local_d0.m_resultData.message.field_2) {
    operator_delete(local_d0.m_resultData.message._M_dataplus._M_p);
  }
  if (local_d0.m_info.capturedExpression.m_data != (char *)0x0) {
    operator_delete__(local_d0.m_info.capturedExpression.m_data);
  }
  if (local_d0.m_info.macroName.m_data != (char *)0x0) {
    operator_delete__(local_d0.m_info.macroName.m_data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_128.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string const& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
        populateReaction( reaction );
    }